

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pTexCoordIdx,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  uint uVar1;
  aiVector3D *paVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  runtime_error *prVar5;
  aiVector3D *this_00;
  long lVar6;
  undefined8 *puVar7;
  uint *pPrimitiveTypes;
  ulong uVar8;
  aiFace *paVar9;
  X3DImporter *this_01;
  ulong uVar10;
  ulong value;
  _List_node_base *p_Var11;
  ulong uVar12;
  undefined1 auVar13 [16];
  vector<aiFace,_std::allocator<aiFace>_> faces;
  uint prim_type;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr_copy;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  vector<aiFace,_std::allocator<aiFace>_> local_b8;
  uint local_9c;
  undefined1 local_98 [8];
  aiVector3t<float> *paStack_90;
  aiVector3t<float> *local_88;
  _Base_ptr local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = (X3DImporter *)local_98;
  local_98 = (undefined1  [8])0x0;
  paStack_90 = (aiVector3t<float> *)0x0;
  local_88 = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78 = (_Base_ptr)pCoordIdx;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
             (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var11 = (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var11 != (_List_node_base *)pTexCoords) {
    do {
      local_d8._0_8_ = p_Var11[1]._M_next;
      local_d8._8_8_ = local_d8._8_8_ & 0xffffffff00000000;
      if (paStack_90 == local_88) {
        this_01 = (X3DImporter *)local_98;
        std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
        _M_realloc_insert<aiVector3t<float>>
                  ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)local_98,
                   (iterator)paStack_90,(aiVector3t<float> *)local_d8);
      }
      else {
        paStack_90->z = 0.0;
        *(undefined8 *)paStack_90 = local_d8._0_8_;
        paStack_90 = paStack_90 + 1;
      }
      p_Var11 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                 &p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var11 != (_List_node_base *)pTexCoords);
  }
  if ((pTexCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (pTexCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    pPrimitiveTypes = &local_9c;
    GeometryHelper_CoordIdxStr2FacesArr
              (this_01,(vector<int,_std::allocator<int>_> *)local_78,&local_b8,pPrimitiveTypes);
  }
  else {
    GeometryHelper_CoordIdxStr2FacesArr(this_01,pTexCoordIdx,&local_b8,&local_9c);
    if (local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,
                 "Failed to add texture coordinates to mesh, faces list is empty.","");
      std::runtime_error::runtime_error(prVar5,(string *)local_d8);
      *(undefined ***)prVar5 = &PTR__runtime_error_007da4b8;
      __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pPrimitiveTypes = (uint *)(ulong)pMesh->mNumFaces;
    if ((uint *)((long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                       super__Vector_impl_data._M_start >> 4) != pPrimitiveTypes) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = &local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,
                 "Texture coordinates faces count must be equal to mesh faces count.","");
      std::runtime_error::runtime_error(prVar5,(string *)local_d8);
      *(undefined ***)prVar5 = &PTR__runtime_error_007da4b8;
      __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  uVar1 = pMesh->mNumVertices;
  uVar12 = (ulong)uVar1 * 0xc;
  this_00 = (aiVector3D *)operator_new__(uVar12);
  if (uVar1 != 0) {
    memset(this_00,0,((uVar12 - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mTextureCoords[0] = this_00;
  pMesh->mNumUVComponents[0] = 2;
  if ((long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar6 = (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4;
    uVar12 = 0;
    do {
      if ((ulong)((long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                        super__Vector_impl_data._M_start >> 4) <= uVar12) {
        auVar13 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar12);
LAB_005fc938:
        local_c8 = *(undefined8 *)pPrimitiveTypes;
LAB_005fc944:
        local_d8._0_8_ = auVar13._8_8_;
        puVar7 = auVar13._0_8_;
        local_d8._8_8_ = puVar7[1];
        *puVar7 = pPrimitiveTypes;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::runtime_error::runtime_error((runtime_error *)this_00,(string *)local_d8);
        *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar9 = pMesh->mFaces;
      pPrimitiveTypes = (uint *)(uVar12 * 0x10);
      value = uVar12;
      if (paVar9[uVar12].mNumIndices !=
          local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12].mNumIndices) {
LAB_005fc8bf:
        this_00 = (aiVector3D *)__cxa_allocate_exception(0x10);
        to_string<unsigned_long>(&local_70,value);
        std::operator+(&local_50,
                       "Number of indices in texture face and mesh face must be equal. Invalid face index: "
                       ,&local_70);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
        auVar4._8_8_ = &local_c8;
        auVar4._0_8_ = puVar7;
        auVar13._8_8_ = (uint *)*puVar7;
        auVar13._0_8_ = puVar7;
        pPrimitiveTypes = (uint *)(puVar7 + 2);
        if ((uint *)*puVar7 == pPrimitiveTypes) {
          local_c8 = *(undefined8 *)pPrimitiveTypes;
          uStack_c0 = puVar7[3];
          auVar13 = auVar4;
          goto LAB_005fc944;
        }
        goto LAB_005fc938;
      }
      if (paVar9[uVar12].mNumIndices != 0) {
        uVar10 = 0;
        do {
          value = uVar12;
          if (((ulong)((long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                             super__Vector_impl_data._M_start >> 4) <= uVar12) ||
             (value = (ulong)local_b8.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar12].mIndices[uVar10],
             uVar8 = ((long)paStack_90 - (long)local_98 >> 2) * -0x5555555555555555,
             uVar8 < value || uVar8 - value == 0)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       value);
            goto LAB_005fc8bf;
          }
          uVar1 = paVar9[uVar12].mIndices[uVar10];
          paVar2 = pMesh->mTextureCoords[0];
          paVar2[uVar1].z = *(float *)((long)local_98 + value * 0xc + 8);
          uVar3 = *(undefined8 *)((long)local_98 + value * 0xc);
          paVar2 = paVar2 + uVar1;
          paVar2->x = (float)(int)uVar3;
          paVar2->y = (float)(int)((ulong)uVar3 >> 0x20);
          uVar10 = uVar10 + 1;
          paVar9 = pMesh->mFaces;
        } while (uVar10 < paVar9[uVar12].mNumIndices);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != lVar6 + (ulong)(lVar6 == 0));
  }
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&local_b8);
  if (local_98 != (undefined1  [8])0x0) {
    operator_delete((void *)local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pTexCoordIdx,
								const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> texcoord_arr_copy;
    std::vector<aiFace> faces;
    unsigned int prim_type;

	// copy list to array because we are need indexed access to normals.
	texcoord_arr_copy.reserve(pTexCoords.size());
	for(std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it)
	{
		texcoord_arr_copy.push_back(aiVector3D((*it).x, (*it).y, 0));
	}

	if(pTexCoordIdx.size() > 0)
	{
		GeometryHelper_CoordIdxStr2FacesArr(pTexCoordIdx, faces, prim_type);
        if ( faces.empty() )
        {
            throw DeadlyImportError( "Failed to add texture coordinates to mesh, faces list is empty." );
        }
        if ( faces.size() != pMesh.mNumFaces )
        {
            throw DeadlyImportError( "Texture coordinates faces count must be equal to mesh faces count." );
        }
	}
	else
	{
		GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
	}

	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
	for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
	{
		if(pMesh.mFaces[fi].mNumIndices != faces.at(fi).mNumIndices)
			throw DeadlyImportError("Number of indices in texture face and mesh face must be equal. Invalid face index: " + to_string(fi) + ".");

		for(size_t ii = 0; ii < pMesh.mFaces[fi].mNumIndices; ii++)
		{
			size_t vert_idx = pMesh.mFaces[fi].mIndices[ii];
			size_t tc_idx = faces.at(fi).mIndices[ii];

			pMesh.mTextureCoords[0][vert_idx] = texcoord_arr_copy.at(tc_idx);
		}
	}// for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
}